

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O1

void __thiscall QScanConverter::scanConvert<false>(QScanConverter *this)

{
  int y;
  int iVar1;
  Line *pLVar2;
  long lVar3;
  Line **ppLVar4;
  Line *pLVar5;
  bool bVar6;
  uint uVar7;
  int x;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong local_50;
  long local_40;
  
  uVar9 = (this->m_lines).siz;
  if (uVar9 != 0) {
    pLVar2 = (this->m_lines).buffer;
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<QScanConverter::Line*,long,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<false>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar2,pLVar2 + uVar9,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<QScanConverter::Line*,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<false>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar2);
    y = ((this->m_lines).buffer)->top;
    if (y <= this->m_bottom) {
      local_40 = 0;
      do {
        lVar11 = (long)(int)local_40;
        if (lVar11 < (this->m_lines).siz) {
          lVar13 = lVar11 << 5;
          do {
            pLVar2 = (this->m_lines).buffer;
            local_40 = lVar11;
            if (*(int *)((long)&pLVar2->top + lVar13) != y) break;
            QDataBuffer<QScanConverter::Line_*>::reserve(&this->m_active,(this->m_active).siz + 1);
            lVar3 = (this->m_active).siz;
            (this->m_active).buffer[lVar3] = (Line *)((long)&pLVar2->x + lVar13);
            (this->m_active).siz = lVar3 + 1;
            lVar11 = lVar11 + 1;
            lVar13 = lVar13 + 0x20;
            local_40 = lVar11;
          } while (lVar11 < (this->m_lines).siz);
        }
        local_50 = (this->m_active).siz;
        uVar12 = (uint)local_50;
        if (1 < (int)uVar12) {
          uVar9 = 1;
          do {
            pLVar2 = (this->m_active).buffer[uVar9];
            lVar11 = pLVar2->x;
            uVar8 = uVar9;
            do {
              ppLVar4 = (this->m_active).buffer;
              pLVar5 = ppLVar4[uVar8 - 1 & 0xffffffff];
              if (pLVar5->x <= lVar11) goto LAB_0042ed91;
              ppLVar4[uVar8] = pLVar5;
              bVar6 = 1 < (long)uVar8;
              uVar8 = uVar8 - 1;
            } while (bVar6);
            uVar8 = 0;
LAB_0042ed91:
            (this->m_active).buffer[(int)uVar8] = pLVar2;
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uVar12 & 0x7fffffff));
        }
        if (0 < (int)uVar12) {
          iVar10 = 0;
          uVar12 = 0;
          x = 0;
          do {
            lVar11 = (long)iVar10;
            pLVar2 = (this->m_active).buffer[lVar11];
            iVar1 = *(int *)((long)&pLVar2->x + 2);
            if ((this->m_fillRuleMask & uVar12) != 0) {
              QSpanBuffer::addSpan(this->m_spanBuffer,x,iVar1 - x,y,0xff);
            }
            uVar12 = uVar12 + pLVar2->winding;
            if (pLVar2->bottom == y) {
              uVar7 = (int)local_50 - 1;
              local_50 = (ulong)uVar7;
              lVar13 = (long)(int)uVar7;
              if (iVar10 < (int)uVar7) {
                do {
                  ppLVar4 = (this->m_active).buffer;
                  ppLVar4[lVar11] = ppLVar4[lVar11 + 1];
                  lVar11 = lVar11 + 1;
                } while (lVar13 != lVar11);
              }
              QDataBuffer<QScanConverter::Line_*>::reserve(&this->m_active,lVar13);
              (this->m_active).siz = lVar13;
            }
            else {
              pLVar2->x = pLVar2->x + pLVar2->delta;
              iVar10 = iVar10 + 1;
            }
            x = iVar1;
          } while (iVar10 < (int)local_50);
        }
        bVar6 = y < this->m_bottom;
        y = y + 1;
      } while (bVar6);
    }
  }
  (this->m_active).siz = 0;
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}